

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O2

void * __thiscall ON_FixedSizePool::Element(ON_FixedSizePool *this,size_t element_index)

{
  void **ppvVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  if (element_index < this->m_total_element_count) {
    puVar4 = (undefined8 *)this->m_first_block;
    do {
      uVar3 = element_index;
      if (puVar4 == (undefined8 *)0x0) {
        return (void *)0x0;
      }
      if (puVar4 == (undefined8 *)this->m_al_block) {
        puVar6 = (undefined8 *)0x0;
        ppvVar1 = &this->m_al_element_array;
      }
      else {
        puVar6 = (undefined8 *)*puVar4;
        ppvVar1 = (void **)(puVar4 + 1);
      }
      puVar5 = puVar4 + 2;
      uVar2 = (ulong)((long)*ppvVar1 - (long)puVar5) / this->m_sizeof_element;
      element_index = uVar3 - uVar2;
      puVar4 = puVar6;
    } while (uVar2 <= uVar3);
    puVar5 = (undefined8 *)((long)puVar5 + this->m_sizeof_element * uVar3);
  }
  else {
    puVar5 = (undefined8 *)0x0;
  }
  return puVar5;
}

Assistant:

void* ON_FixedSizePool::Element(size_t element_index) const
{
  if (element_index < (size_t)m_total_element_count)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    size_t block_count;

    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        next_block = nullptr;

        // for debugging
        // block += sizeof(void*);
        // block_end = *((const char**)(block));
        // block += sizeof(void*);

        block_end = (const char*)m_al_element_array;
        block += 2*sizeof(void*);
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      block_count = (block_end - block) / m_sizeof_element;
      if (element_index < block_count)
        return ((void*)(block + element_index*m_sizeof_element));
      element_index -= block_count;
    }
  }

  return nullptr;
}